

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void node_accept_pattern(ACT_NODE_t *nod,AC_PATTERN_t *new_patt,int copy)

{
  size_t sVar1;
  size_t sVar2;
  mpool *pool;
  AC_ALPHABET_t *pAVar3;
  ac_pattid_type aVar4;
  undefined4 uVar5;
  AC_PATTERN_t *pAVar6;
  AC_ALPHABET_t *pAVar7;
  anon_union_8_2_1f4d99a2_for_u aVar8;
  AC_TEXT_t *new_txt;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  
  sVar1 = nod->matched_size;
  if (sVar1 != 0) {
    sVar9 = 0;
    do {
      sVar2 = nod->matched[sVar9].ptext.length;
      if (sVar2 == (new_patt->ptext).length) {
        if (sVar2 == 0) {
          sVar11 = 0;
        }
        else {
          sVar10 = 0;
          do {
            sVar11 = sVar10;
            if (nod->matched[sVar9].ptext.astring[sVar10] != (new_patt->ptext).astring[sVar10])
            break;
            sVar10 = sVar10 + 1;
            sVar11 = sVar2;
          } while (sVar2 != sVar10);
        }
        if (sVar11 == sVar2) {
          return;
        }
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != sVar1);
  }
  sVar9 = nod->matched_capacity;
  if (sVar1 == sVar9) {
    if (sVar9 == 0) {
      nod->matched_capacity = 1;
      pAVar6 = (AC_PATTERN_t *)malloc(0x30);
    }
    else {
      nod->matched_capacity = sVar9 + 2;
      pAVar6 = (AC_PATTERN_t *)realloc(nod->matched,(sVar9 + 2) * 0x30);
    }
    nod->matched = pAVar6;
  }
  sVar1 = nod->matched_size;
  nod->matched_size = sVar1 + 1;
  pAVar6 = nod->matched + sVar1;
  if (copy == 0) {
    pAVar7 = (new_patt->ptext).astring;
    sVar1 = (new_patt->ptext).length;
    pAVar3 = (new_patt->rtext).astring;
    sVar9 = (new_patt->rtext).length;
    aVar4 = (new_patt->id).type;
    uVar5 = *(undefined4 *)&(new_patt->id).field_0xc;
    (pAVar6->id).u = (new_patt->id).u;
    (pAVar6->id).type = aVar4;
    *(undefined4 *)&(pAVar6->id).field_0xc = uVar5;
    (pAVar6->rtext).astring = pAVar3;
    (pAVar6->rtext).length = sVar9;
    (pAVar6->ptext).astring = pAVar7;
    (pAVar6->ptext).length = sVar1;
  }
  else {
    pool = nod->trie->mp;
    pAVar7 = (AC_ALPHABET_t *)mpool_strndup(pool,(new_patt->ptext).astring,(new_patt->ptext).length)
    ;
    (pAVar6->ptext).astring = pAVar7;
    (pAVar6->ptext).length = (new_patt->ptext).length;
    pAVar7 = (AC_ALPHABET_t *)mpool_strndup(pool,(new_patt->rtext).astring,(new_patt->rtext).length)
    ;
    (pAVar6->rtext).astring = pAVar7;
    (pAVar6->rtext).length = (new_patt->rtext).length;
    if ((new_patt->id).type == AC_PATTID_TYPE_STRING) {
      aVar8.stringy = (char *)mpool_strdup(pool,(new_patt->id).u.stringy);
    }
    else {
      aVar8 = (new_patt->id).u;
    }
    (pAVar6->id).u.stringy = (char *)aVar8;
    (pAVar6->id).type = (new_patt->id).type;
  }
  return;
}

Assistant:

void node_accept_pattern (ACT_NODE_t *nod, AC_PATTERN_t *new_patt, int copy)
{
    AC_PATTERN_t *patt;
    
    /* Check if the new pattern already exists in the node list */
    if (node_has_pattern(nod, new_patt))
        return;
    
    /* Manage memory */
    if (nod->matched_size == nod->matched_capacity)
        node_grow_matched_vector (nod);
    
    patt = &nod->matched[nod->matched_size++];
    
    if (copy)
    {
        /* Deep copy */
        node_copy_pattern (nod, patt, new_patt);
    }
    else
    {
        /* Shallow copy */
        *patt = *new_patt;
    }
}